

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::AppendableFile,_std::nullptr_t> __thiscall kj::newDiskAppendableFile(kj *this,OwnFd *fd)

{
  OwnFd *params;
  AppendableFile *extraout_RDX;
  Own<kj::AppendableFile,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskAppendableFile,_std::nullptr_t> local_28;
  OwnFd *local_18;
  OwnFd *fd_local;
  
  local_18 = fd;
  fd_local = (OwnFd *)this;
  params = mv<kj::OwnFd>(fd);
  heap<kj::(anonymous_namespace)::DiskAppendableFile,kj::OwnFd>((kj *)&local_28,params);
  Own<kj::AppendableFile,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskAppendableFile,void>
            ((Own<kj::AppendableFile,decltype(nullptr)> *)this,&local_28);
  Own<kj::(anonymous_namespace)::DiskAppendableFile,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AppendableFile> newDiskAppendableFile(kj::OwnFd fd) {
  return heap<DiskAppendableFile>(kj::mv(fd));
}